

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void start_reboot(CHAR_DATA *ch)

{
  char *pcVar1;
  char *pcVar2;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed90;
  allocator<char> local_1261;
  string local_1260 [16];
  allocator<char> *in_stack_ffffffffffffedb0;
  char *in_stack_ffffffffffffedb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedc0;
  allocator<char> local_1229;
  string local_1228 [32];
  char local_1208 [160];
  char_data **in_stack_ffffffffffffee98;
  _func_void_char_data_ptr *in_stack_ffffffffffffeea0;
  string *in_stack_ffffffffffffeea8;
  string *in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeebc;
  CQueue *in_stack_ffffffffffffeec0;
  
  if (reboot_num == -1) {
    rebooting = false;
    do_echo((CHAR_DATA *)buf._4368_8_,(char *)buf._4360_8_);
  }
  else if (reboot_num == 0) {
    reboot_now(in_stack_ffffffffffffed90);
  }
  else if ((reboot_num < 6) || (reboot_num % 5 == 0)) {
    pcVar1 = int_to_cap_string(reboot_num);
    pcVar2 = "S";
    if (reboot_num == 1) {
      pcVar2 = "";
    }
    sprintf(local_1208,"*** REBOOT IN %s MINUTE%s ***",pcVar1,pcVar2);
    do_echo((CHAR_DATA *)buf._4368_8_,(char *)buf._4360_8_);
    reboot_num = reboot_num + -1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
    CQueue::AddToQueue<void(*)(char_data*),char_data*&>
              (in_stack_ffffffffffffeec0,in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb0,
               in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98);
    std::__cxx11::string::~string(local_1260);
    std::allocator<char>::~allocator(&local_1261);
    std::__cxx11::string::~string(local_1228);
    std::allocator<char>::~allocator(&local_1229);
  }
  return;
}

Assistant:

void start_reboot(CHAR_DATA *ch)
{
	char buf[MSL];

	if (reboot_num == -1)
	{
		rebooting = false;
		do_echo(ch, "*** REBOOT CANCELLED ***");
	}
	else if (reboot_num == 0)
	{
		reboot_now(ch);
	}
	else
	{
		if (reboot_num < 6 || (reboot_num % 5 == 0))
		{
			sprintf(buf, "*** REBOOT IN %s MINUTE%s ***", int_to_cap_string(reboot_num), (reboot_num == 1) ? "" : "S");
			do_echo(ch, buf);

			reboot_num--;
			RS.Queue.AddToQueue(60, "start_reboot", "start_reboot", start_reboot, ch);
		}
	}
}